

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmRulePlaceholderExpander.cxx
# Opt level: O2

string * __thiscall
cmRulePlaceholderExpander::ExpandRuleVariable
          (string *__return_storage_ptr__,cmRulePlaceholderExpander *this,
          cmOutputConverter *outputConverter,string *variable,RuleVariables *replaceValues)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *this_00;
  bool bVar1;
  long lVar2;
  string *in_relative;
  iterator iVar3;
  mapped_type *pmVar4;
  mapped_type *pmVar5;
  _Base_ptr __rhs;
  cmRulePlaceholderExpander *remote;
  char *pcVar6;
  string targetBase;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  mapped_type *local_50;
  mapped_type *local_48;
  mapped_type *local_40;
  mapped_type *local_38;
  
  if ((replaceValues->LinkFlags != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"LINK_FLAGS"), bVar1)) {
    pcVar6 = replaceValues->LinkFlags;
    goto LAB_00309352;
  }
  if ((replaceValues->Manifests != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"MANIFESTS"), bVar1)) {
    pcVar6 = replaceValues->Manifests;
    goto LAB_00309352;
  }
  if ((replaceValues->Flags != (char *)0x0) && (bVar1 = std::operator==(variable,"FLAGS"), bVar1)) {
    pcVar6 = replaceValues->Flags;
    goto LAB_00309352;
  }
  if ((replaceValues->Source != (char *)0x0) && (bVar1 = std::operator==(variable,"SOURCE"), bVar1))
  {
    pcVar6 = replaceValues->Source;
    goto LAB_00309352;
  }
  if ((replaceValues->PreprocessedSource != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"PREPROCESSED_SOURCE"), bVar1)) {
    pcVar6 = replaceValues->PreprocessedSource;
    goto LAB_00309352;
  }
  if ((replaceValues->AssemblySource != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"ASSEMBLY_SOURCE"), bVar1)) {
    pcVar6 = replaceValues->AssemblySource;
    goto LAB_00309352;
  }
  if ((replaceValues->Object != (char *)0x0) && (bVar1 = std::operator==(variable,"OBJECT"), bVar1))
  {
    pcVar6 = replaceValues->Object;
    goto LAB_00309352;
  }
  if ((replaceValues->ObjectDir != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"OBJECT_DIR"), bVar1)) {
    pcVar6 = replaceValues->ObjectDir;
    goto LAB_00309352;
  }
  if ((replaceValues->ObjectFileDir != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"OBJECT_FILE_DIR"), bVar1)) {
    pcVar6 = replaceValues->ObjectFileDir;
    goto LAB_00309352;
  }
  if ((replaceValues->Objects != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"OBJECTS"), bVar1)) {
    pcVar6 = replaceValues->Objects;
    goto LAB_00309352;
  }
  if ((replaceValues->ObjectsQuoted != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"OBJECTS_QUOTED"), bVar1)) {
    pcVar6 = replaceValues->ObjectsQuoted;
    goto LAB_00309352;
  }
  if ((replaceValues->Defines != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"DEFINES"), bVar1)) {
    pcVar6 = replaceValues->Defines;
    goto LAB_00309352;
  }
  if ((replaceValues->Includes != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"INCLUDES"), bVar1)) {
    pcVar6 = replaceValues->Includes;
    goto LAB_00309352;
  }
  if ((replaceValues->TargetPDB != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"TARGET_PDB"), bVar1)) {
    pcVar6 = replaceValues->TargetPDB;
    goto LAB_00309352;
  }
  if ((replaceValues->TargetCompilePDB != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"TARGET_COMPILE_PDB"), bVar1)) {
    pcVar6 = replaceValues->TargetCompilePDB;
    goto LAB_00309352;
  }
  if ((replaceValues->DependencyFile != (char *)0x0) &&
     (bVar1 = std::operator==(variable,"DEP_FILE"), bVar1)) {
    pcVar6 = replaceValues->DependencyFile;
    goto LAB_00309352;
  }
  if (replaceValues->Target == (char *)0x0) {
LAB_003092a3:
    bVar1 = std::operator==(variable,"TARGET_SONAME");
    if ((bVar1) ||
       ((bVar1 = std::operator==(variable,"SONAME_FLAG"), bVar1 ||
        (bVar1 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar1)))) {
      if (replaceValues->TargetSOName != (char *)0x0) {
        bVar1 = std::operator==(variable,"TARGET_SONAME");
        if (bVar1) {
          pcVar6 = replaceValues->TargetSOName;
          goto LAB_00309352;
        }
        bVar1 = std::operator==(variable,"SONAME_FLAG");
        if ((bVar1) && (pcVar6 = replaceValues->SONameFlag, pcVar6 != (char *)0x0))
        goto LAB_00309352;
        if ((replaceValues->TargetInstallNameDir != (char *)0x0) &&
           (bVar1 = std::operator==(variable,"TARGET_INSTALLNAME_DIR"), bVar1)) {
          pcVar6 = replaceValues->TargetInstallNameDir;
          goto LAB_00309352;
        }
      }
      pcVar6 = "";
    }
    else if ((replaceValues->LinkLibraries == (char *)0x0) ||
            (bVar1 = std::operator==(variable,"LINK_LIBRARIES"), !bVar1)) {
      if ((replaceValues->Language == (char *)0x0) ||
         (bVar1 = std::operator==(variable,"LANGUAGE"), !bVar1)) {
        if ((replaceValues->CMTargetName == (char *)0x0) ||
           (bVar1 = std::operator==(variable,"TARGET_NAME"), !bVar1)) {
          if ((replaceValues->CMTargetType == (char *)0x0) ||
             (bVar1 = std::operator==(variable,"TARGET_TYPE"), !bVar1)) {
            if ((replaceValues->Output == (char *)0x0) ||
               (bVar1 = std::operator==(variable,"OUTPUT"), !bVar1)) {
              bVar1 = std::operator==(variable,"CMAKE_COMMAND");
              if (bVar1) {
                in_relative = cmSystemTools::GetCMakeCommand_abi_cxx11_();
                cmsys::SystemTools::CollapseFullPath(&targetBase,in_relative);
                cmOutputConverter::ConvertToOutputFormat
                          (__return_storage_ptr__,outputConverter,&targetBase,SHELL);
              }
              else {
                iVar3 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        ::find(&(this->Compilers)._M_t,variable);
                this_00 = &this->VariableMappings;
                if ((_Rb_tree_header *)iVar3._M_node ==
                    &(this->Compilers)._M_t._M_impl.super__Rb_tree_header) {
                  iVar3 = std::
                          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          ::find(&this_00->_M_t,variable);
                  remote = (cmRulePlaceholderExpander *)variable;
                  if ((_Rb_tree_header *)iVar3._M_node !=
                      &(this->VariableMappings)._M_t._M_impl.super__Rb_tree_header) {
                    lVar2 = std::__cxx11::string::find((char *)variable,0x576121);
                    remote = (cmRulePlaceholderExpander *)(iVar3._M_node + 2);
                    if (lVar2 == -1) {
                      cmOutputConverter::ConvertToOutputForExisting
                                (__return_storage_ptr__,outputConverter,(string *)remote,SHELL);
                      return __return_storage_ptr__;
                    }
                  }
LAB_003091fc:
                  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)remote);
                  return __return_storage_ptr__;
                }
                __rhs = iVar3._M_node + 2;
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILER");
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](this_00,&targetBase);
                cmOutputConverter::ConvertToOutputForExisting
                          (__return_storage_ptr__,outputConverter,pmVar4,SHELL);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILER_ARG1");
                local_38 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILER_TARGET");
                local_40 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILE_OPTIONS_TARGET");
                local_50 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILER_EXTERNAL_TOOLCHAIN");
                local_48 = std::
                           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN");
                pmVar4 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                std::operator+(&local_70,"CMAKE_",
                               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                               __rhs);
                std::operator+(&targetBase,&local_70,"_COMPILE_OPTIONS_SYSROOT");
                pmVar5 = std::
                         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         ::operator[](this_00,&targetBase);
                std::__cxx11::string::~string((string *)&targetBase);
                std::__cxx11::string::~string((string *)&local_70);
                if (local_38->_M_string_length != 0) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                }
                if ((local_40->_M_string_length != 0) && (local_50->_M_string_length != 0)) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                }
                if ((local_48->_M_string_length != 0) && (pmVar4->_M_string_length != 0)) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                  cmOutputConverter::EscapeForShell
                            (&targetBase,outputConverter,local_48,true,false,false);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                  std::__cxx11::string::~string((string *)&targetBase);
                }
                targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
                targetBase._M_string_length = 0;
                targetBase.field_2._M_local_buf[0] = '\0';
                std::__cxx11::string::_M_assign((string *)&targetBase);
                if ((targetBase._M_string_length != 0) && (pmVar5->_M_string_length != 0)) {
                  std::__cxx11::string::append((char *)__return_storage_ptr__);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                  cmOutputConverter::EscapeForShell
                            (&local_70,outputConverter,&targetBase,true,false,false);
                  std::__cxx11::string::append((string *)__return_storage_ptr__);
                  std::__cxx11::string::~string((string *)&local_70);
                }
              }
LAB_00309880:
              std::__cxx11::string::~string((string *)&targetBase);
              return __return_storage_ptr__;
            }
            pcVar6 = replaceValues->Output;
          }
          else {
            pcVar6 = replaceValues->CMTargetType;
          }
        }
        else {
          pcVar6 = replaceValues->CMTargetName;
        }
      }
      else {
        pcVar6 = replaceValues->Language;
      }
    }
    else {
      pcVar6 = replaceValues->LinkLibraries;
    }
  }
  else {
    bVar1 = std::operator==(variable,"TARGET_QUOTED");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&targetBase);
      if (__return_storage_ptr__->_M_string_length == 0) {
        return __return_storage_ptr__;
      }
      if (*(__return_storage_ptr__->_M_dataplus)._M_p == '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,'\"');
      std::__cxx11::string::append((char *)__return_storage_ptr__);
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      return __return_storage_ptr__;
    }
    bVar1 = std::operator==(variable,"TARGET_UNQUOTED");
    if (bVar1) {
      std::__cxx11::string::string
                ((string *)__return_storage_ptr__,replaceValues->Target,(allocator *)&targetBase);
      if (__return_storage_ptr__->_M_string_length < 3) {
        return __return_storage_ptr__;
      }
      pcVar6 = (__return_storage_ptr__->_M_dataplus)._M_p;
      if (*pcVar6 != '\"') {
        return __return_storage_ptr__;
      }
      if (pcVar6[__return_storage_ptr__->_M_string_length - 1] != '\"') {
        return __return_storage_ptr__;
      }
      std::__cxx11::string::substr((ulong)&targetBase,(ulong)__return_storage_ptr__);
      std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&targetBase);
      goto LAB_00309880;
    }
    if ((replaceValues->LanguageCompileFlags != (char *)0x0) &&
       (bVar1 = std::operator==(variable,"LANGUAGE_COMPILE_FLAGS"), bVar1)) {
      pcVar6 = replaceValues->LanguageCompileFlags;
      goto LAB_00309352;
    }
    if ((replaceValues->Target != (char *)0x0) &&
       (bVar1 = std::operator==(variable,"TARGET"), bVar1)) {
      pcVar6 = replaceValues->Target;
      goto LAB_00309352;
    }
    bVar1 = std::operator==(variable,"TARGET_IMPLIB");
    remote = this;
    if (bVar1) goto LAB_003091fc;
    bVar1 = std::operator==(variable,"TARGET_VERSION_MAJOR");
    if (bVar1) {
      pcVar6 = replaceValues->TargetVersionMajor;
    }
    else {
      bVar1 = std::operator==(variable,"TARGET_VERSION_MINOR");
      if (!bVar1) {
        if ((replaceValues->Target != (char *)0x0) &&
           (bVar1 = std::operator==(variable,"TARGET_BASE"), bVar1)) {
          std::__cxx11::string::string
                    ((string *)&targetBase,replaceValues->Target,(allocator *)&local_70);
          lVar2 = std::__cxx11::string::rfind((char)&targetBase,0x2e);
          if (lVar2 == -1) {
            (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetBase._M_dataplus._M_p == &targetBase.field_2) {
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                            targetBase.field_2._M_local_buf[0]);
              *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = targetBase.field_2._8_8_
              ;
            }
            else {
              (__return_storage_ptr__->_M_dataplus)._M_p = targetBase._M_dataplus._M_p;
              (__return_storage_ptr__->field_2)._M_allocated_capacity =
                   CONCAT71(targetBase.field_2._M_allocated_capacity._1_7_,
                            targetBase.field_2._M_local_buf[0]);
            }
            __return_storage_ptr__->_M_string_length = targetBase._M_string_length;
            targetBase._M_string_length = 0;
            targetBase.field_2._M_local_buf[0] = '\0';
            targetBase._M_dataplus._M_p = (pointer)&targetBase.field_2;
          }
          else {
            std::__cxx11::string::substr((ulong)__return_storage_ptr__,(ulong)&targetBase);
          }
          goto LAB_00309880;
        }
        goto LAB_003092a3;
      }
      pcVar6 = replaceValues->TargetVersionMinor;
    }
    if (pcVar6 == (char *)0x0) {
      pcVar6 = "0";
    }
  }
LAB_00309352:
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar6,(allocator *)&targetBase);
  return __return_storage_ptr__;
}

Assistant:

std::string cmRulePlaceholderExpander::ExpandRuleVariable(
  cmOutputConverter* outputConverter, std::string const& variable,
  const RuleVariables& replaceValues)
{
  if (replaceValues.LinkFlags) {
    if (variable == "LINK_FLAGS") {
      return replaceValues.LinkFlags;
    }
  }
  if (replaceValues.Manifests) {
    if (variable == "MANIFESTS") {
      return replaceValues.Manifests;
    }
  }
  if (replaceValues.Flags) {
    if (variable == "FLAGS") {
      return replaceValues.Flags;
    }
  }

  if (replaceValues.Source) {
    if (variable == "SOURCE") {
      return replaceValues.Source;
    }
  }
  if (replaceValues.PreprocessedSource) {
    if (variable == "PREPROCESSED_SOURCE") {
      return replaceValues.PreprocessedSource;
    }
  }
  if (replaceValues.AssemblySource) {
    if (variable == "ASSEMBLY_SOURCE") {
      return replaceValues.AssemblySource;
    }
  }
  if (replaceValues.Object) {
    if (variable == "OBJECT") {
      return replaceValues.Object;
    }
  }
  if (replaceValues.ObjectDir) {
    if (variable == "OBJECT_DIR") {
      return replaceValues.ObjectDir;
    }
  }
  if (replaceValues.ObjectFileDir) {
    if (variable == "OBJECT_FILE_DIR") {
      return replaceValues.ObjectFileDir;
    }
  }
  if (replaceValues.Objects) {
    if (variable == "OBJECTS") {
      return replaceValues.Objects;
    }
  }
  if (replaceValues.ObjectsQuoted) {
    if (variable == "OBJECTS_QUOTED") {
      return replaceValues.ObjectsQuoted;
    }
  }
  if (replaceValues.Defines && variable == "DEFINES") {
    return replaceValues.Defines;
  }
  if (replaceValues.Includes && variable == "INCLUDES") {
    return replaceValues.Includes;
  }
  if (replaceValues.TargetPDB) {
    if (variable == "TARGET_PDB") {
      return replaceValues.TargetPDB;
    }
  }
  if (replaceValues.TargetCompilePDB) {
    if (variable == "TARGET_COMPILE_PDB") {
      return replaceValues.TargetCompilePDB;
    }
  }
  if (replaceValues.DependencyFile) {
    if (variable == "DEP_FILE") {
      return replaceValues.DependencyFile;
    }
  }

  if (replaceValues.Target) {
    if (variable == "TARGET_QUOTED") {
      std::string targetQuoted = replaceValues.Target;
      if (!targetQuoted.empty() && targetQuoted[0] != '\"') {
        targetQuoted = '\"';
        targetQuoted += replaceValues.Target;
        targetQuoted += '\"';
      }
      return targetQuoted;
    }
    if (variable == "TARGET_UNQUOTED") {
      std::string unquoted = replaceValues.Target;
      std::string::size_type sz = unquoted.size();
      if (sz > 2 && unquoted[0] == '\"' && unquoted[sz - 1] == '\"') {
        unquoted = unquoted.substr(1, sz - 2);
      }
      return unquoted;
    }
    if (replaceValues.LanguageCompileFlags) {
      if (variable == "LANGUAGE_COMPILE_FLAGS") {
        return replaceValues.LanguageCompileFlags;
      }
    }
    if (replaceValues.Target) {
      if (variable == "TARGET") {
        return replaceValues.Target;
      }
    }
    if (variable == "TARGET_IMPLIB") {
      return this->TargetImpLib;
    }
    if (variable == "TARGET_VERSION_MAJOR") {
      if (replaceValues.TargetVersionMajor) {
        return replaceValues.TargetVersionMajor;
      }
      return "0";
    }
    if (variable == "TARGET_VERSION_MINOR") {
      if (replaceValues.TargetVersionMinor) {
        return replaceValues.TargetVersionMinor;
      }
      return "0";
    }
    if (replaceValues.Target) {
      if (variable == "TARGET_BASE") {
        // Strip the last extension off the target name.
        std::string targetBase = replaceValues.Target;
        std::string::size_type pos = targetBase.rfind('.');
        if (pos != std::string::npos) {
          return targetBase.substr(0, pos);
        }
        return targetBase;
      }
    }
  }
  if (variable == "TARGET_SONAME" || variable == "SONAME_FLAG" ||
      variable == "TARGET_INSTALLNAME_DIR") {
    // All these variables depend on TargetSOName
    if (replaceValues.TargetSOName) {
      if (variable == "TARGET_SONAME") {
        return replaceValues.TargetSOName;
      }
      if (variable == "SONAME_FLAG" && replaceValues.SONameFlag) {
        return replaceValues.SONameFlag;
      }
      if (replaceValues.TargetInstallNameDir &&
          variable == "TARGET_INSTALLNAME_DIR") {
        return replaceValues.TargetInstallNameDir;
      }
    }
    return "";
  }
  if (replaceValues.LinkLibraries) {
    if (variable == "LINK_LIBRARIES") {
      return replaceValues.LinkLibraries;
    }
  }
  if (replaceValues.Language) {
    if (variable == "LANGUAGE") {
      return replaceValues.Language;
    }
  }
  if (replaceValues.CMTargetName) {
    if (variable == "TARGET_NAME") {
      return replaceValues.CMTargetName;
    }
  }
  if (replaceValues.CMTargetType) {
    if (variable == "TARGET_TYPE") {
      return replaceValues.CMTargetType;
    }
  }
  if (replaceValues.Output) {
    if (variable == "OUTPUT") {
      return replaceValues.Output;
    }
  }
  if (variable == "CMAKE_COMMAND") {
    return outputConverter->ConvertToOutputFormat(
      cmSystemTools::CollapseFullPath(cmSystemTools::GetCMakeCommand()),
      cmOutputConverter::SHELL);
  }

  std::map<std::string, std::string>::iterator compIt =
    this->Compilers.find(variable);

  if (compIt != this->Compilers.end()) {
    std::string ret = outputConverter->ConvertToOutputForExisting(
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER"]);
    std::string const& compilerArg1 =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_ARG1"];
    std::string const& compilerTarget =
      this->VariableMappings["CMAKE_" + compIt->second + "_COMPILER_TARGET"];
    std::string const& compilerOptionTarget =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_TARGET"];
    std::string const& compilerExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILER_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionExternalToolchain =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_EXTERNAL_TOOLCHAIN"];
    std::string const& compilerOptionSysroot =
      this->VariableMappings["CMAKE_" + compIt->second +
                             "_COMPILE_OPTIONS_SYSROOT"];

    // if there is a required first argument to the compiler add it
    // to the compiler string
    if (!compilerArg1.empty()) {
      ret += " ";
      ret += compilerArg1;
    }
    if (!compilerTarget.empty() && !compilerOptionTarget.empty()) {
      ret += " ";
      ret += compilerOptionTarget;
      ret += compilerTarget;
    }
    if (!compilerExternalToolchain.empty() &&
        !compilerOptionExternalToolchain.empty()) {
      ret += " ";
      ret += compilerOptionExternalToolchain;
      ret += outputConverter->EscapeForShell(compilerExternalToolchain, true);
    }
    std::string sysroot;
    // Some platforms may use separate sysroots for compiling and linking.
    // If we detect link flags, then we pass the link sysroot instead.
    // FIXME: Use a more robust way to detect link line expansion.
    if (replaceValues.LinkFlags) {
      sysroot = this->LinkerSysroot;
    } else {
      sysroot = this->CompilerSysroot;
    }
    if (!sysroot.empty() && !compilerOptionSysroot.empty()) {
      ret += " ";
      ret += compilerOptionSysroot;
      ret += outputConverter->EscapeForShell(sysroot, true);
    }
    return ret;
  }

  std::map<std::string, std::string>::iterator mapIt =
    this->VariableMappings.find(variable);
  if (mapIt != this->VariableMappings.end()) {
    if (variable.find("_FLAG") == std::string::npos) {
      return outputConverter->ConvertToOutputForExisting(mapIt->second);
    }
    return mapIt->second;
  }
  return variable;
}